

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<float,_4U>::resample
          (ImageT<float,_4U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  void *pvVar5;
  char cVar6;
  ImageT<float,_4U> *this_00;
  Resampler *this_01;
  ulong uVar7;
  float *pfVar8;
  runtime_error *this_02;
  uint uVar9;
  undefined4 *puVar10;
  long lVar11;
  uint32_t c;
  uint uVar12;
  uint uVar13;
  Contrib_List *pCVar14;
  ulong uVar15;
  undefined4 in_register_00000034;
  TransferFunctionSRGB *pTVar16;
  undefined4 in_register_00000084;
  char *pFilter;
  Boundary_Op BVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar18;
  Contrib_List *pCVar19;
  ulong uVar20;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *this_03;
  TransferFunctionSRGB *pTVar21;
  pointer __p;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  format_args args;
  string_view fmt;
  int local_12c;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL> resamplers
  ;
  array<const_float_*,_4UL> outputLine;
  array<std::vector<float,_std::allocator<float>_>,_4UL> samples;
  long lStack_48;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  
  pFilter = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar11 = CONCAT44(in_register_00000034,targetWidth);
  BVar17 = in_R9._0_4_;
  this_00 = (ImageT<float,_4U> *)operator_new(0x28);
  uVar9 = (uint)filter;
  ImageT(this_00,targetHeight,uVar9);
  uVar3 = *(undefined8 *)(lVar11 + 0x10);
  (this_00->super_Image).transferFunction = (int)uVar3;
  (this_00->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  if ((((uVar9 == 0) || (targetHeight == 0)) || (uVar1 = *(uint *)(lVar11 + 8), uVar1 == 0)) ||
     (uVar2 = *(uint *)(lVar11 + 0xc), uVar2 == 0)) {
    __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x461,
                  "virtual std::unique_ptr<Image> ImageT<float, 4>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = float, componentCount = 4]"
                 );
  }
  uVar12 = uVar2;
  if (uVar2 < uVar1) {
    uVar12 = uVar1;
  }
  uVar13 = uVar9;
  if (uVar9 < targetHeight) {
    uVar13 = targetHeight;
  }
  if ((uVar13 < 0x4001) && (uVar12 < 0x4001)) {
    samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_03 = resamplers._M_elems;
    resamplers._M_elems[2]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    resamplers._M_elems[3]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    resamplers._M_elems[0]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    resamplers._M_elems[1]._M_t.
    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
    super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
         (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
         (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
    lVar18 = 0;
    do {
      if (lVar18 == 0) {
        pCVar19 = (Contrib_List *)0x0;
        pCVar14 = (Contrib_List *)0x0;
      }
      else {
        pCVar19 = *(Contrib_List **)
                   ((long)resamplers._M_elems[0]._M_t.
                          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                          .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x30);
        pCVar14 = *(Contrib_List **)
                   ((long)resamplers._M_elems[0]._M_t.
                          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                          .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x38);
      }
      this_01 = (Resampler *)operator_new(0x78);
      basisu::Resampler::Resampler
                (this_01,uVar1,uVar2,targetHeight,uVar9,BVar17,0.0,0.0,pFilter,pCVar19,pCVar14,
                 filterScale,filterScale,0.0,0.0);
      outputLine._M_elems[0] = (float *)0x0;
      std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 this_03,this_01);
      std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 &outputLine);
      checkResamplerStatus
                ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                  &this_03->_M_t)->_M_t).
                 super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                 .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar18),(ulong)uVar1);
      this_03 = this_03 + 1;
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0x60);
    tfSRGB.super_TransferFunction._vptr_TransferFunction = (TransferFunction)&PTR_encode_0025c910;
    tfLinear.super_TransferFunction._vptr_TransferFunction = (TransferFunction)&PTR_encode_0025c968;
    pTVar21 = &tfSRGB;
    if (*(int *)(lVar11 + 0x10) != 2) {
      pTVar21 = (TransferFunctionSRGB *)&tfLinear;
    }
    uVar7 = 0;
    local_12c = 0;
    uVar9 = 0;
    do {
      uVar15 = 0;
      uVar20 = uVar7;
      do {
        puVar10 = (undefined4 *)(uVar20 * 0x10 + *(long *)(lVar11 + 0x18));
        lVar18 = -0x18;
        do {
          pTVar16 = pTVar21;
          if (lVar18 == -6) {
            pTVar16 = (TransferFunctionSRGB *)&tfLinear;
          }
          (*(pTVar16->super_TransferFunction)._vptr_TransferFunction[1])(*puVar10);
          *(undefined4 *)(*(long *)((long)&lStack_48 + lVar18 * 4) + uVar15 * 4) = extraout_XMM0_Da;
          puVar10 = puVar10 + 1;
          lVar18 = lVar18 + 6;
        } while (lVar18 != 0);
        uVar15 = uVar15 + 1;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (uVar15 != uVar1);
      lVar18 = 0;
      do {
        cVar6 = basisu::Resampler::put_line
                          ((float *)resamplers._M_elems[lVar18]._M_t.
                                    super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                    .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl)
        ;
        if (cVar6 == '\0') {
          checkResamplerStatus
                    (resamplers._M_elems[lVar18]._M_t.
                     super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                     .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      uVar12 = targetHeight * local_12c;
      while( true ) {
        outputLine._M_elems[2] = (float *)0x0;
        outputLine._M_elems[3] = (float *)0x0;
        outputLine._M_elems[0] = (float *)0x0;
        outputLine._M_elems[1] = (float *)0x0;
        lVar18 = 0;
        do {
          pfVar8 = (float *)basisu::Resampler::get_line();
          outputLine._M_elems[lVar18] = pfVar8;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        if (outputLine._M_elems[0] == (float *)0x0) break;
        uVar20 = 0;
        uVar13 = uVar12;
        do {
          pCVar4 = this_00->pixels;
          lVar18 = 0;
          do {
            pTVar16 = pTVar21;
            if (lVar18 == 3) {
              pTVar16 = (TransferFunctionSRGB *)&tfLinear;
            }
            (**(pTVar16->super_TransferFunction)._vptr_TransferFunction)
                      (outputLine._M_elems[lVar18][uVar20]);
            pCVar4[uVar13].field_0.comps[lVar18] = extraout_XMM0_Da_00;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          uVar20 = uVar20 + 1;
          uVar13 = uVar13 + 1;
        } while (uVar20 != targetHeight);
        local_12c = local_12c + 1;
        uVar12 = uVar12 + targetHeight;
      }
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)((int)uVar7 + uVar1);
    } while (uVar9 != uVar2);
    (this->super_Image)._vptr_Image = (_func_int **)this_00;
    lVar11 = 0x18;
    do {
      std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                 ((long)&resamplers._M_elems[0]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + lVar11));
      lVar11 = lVar11 + -8;
    } while (lVar11 != -8);
    lVar11 = 0x60;
    do {
      pvVar5 = *(void **)((long)outputLine._M_elems + lVar11 + 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)((long)outputLine._M_elems + lVar11 + 0x18) - (long)pvVar5);
      }
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != 0);
    return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
           (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  resamplers._M_elems[0]._M_t.
  super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
  super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
  super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
       (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
       (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&resamplers;
  fmt.size_ = 1;
  fmt.data_ = (char *)0x2a;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
  std::runtime_error::runtime_error(this_02,(string *)&samples);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }